

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derTUINTEnc(octet *der,u32 tag,octet *val,size_t len)

{
  byte bVar1;
  size_t sVar2;
  octet *dest;
  size_t sVar3;
  ulong count;
  bool bVar4;
  
  bVar4 = len != 0;
  for (; (count = (ulong)bVar4, 1 < len && (count = len, val[len - 1] == '\0')); len = len - 1) {
  }
  bVar1 = val[count - 1];
  sVar3 = (bVar1 >> 7) + count;
  sVar2 = derTLEnc(der,tag,sVar3);
  if (sVar2 == 0xffffffffffffffff) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    if (der != (octet *)0x0) {
      dest = der + sVar2;
      memCopy(dest,val,count);
      if ((char)bVar1 < '\0') {
        dest[count] = '\0';
      }
      memRev(dest,sVar3);
    }
    sVar3 = sVar3 + sVar2;
  }
  return sVar3;
}

Assistant:

size_t derTUINTEnc(octet der[], u32 tag, const octet* val, size_t len)
{
	size_t ex;
	size_t tl_count;
	// pre
	ASSERT(len > 0);
	ASSERT(memIsValid(val, len));
	// исключить незначащие нули V
	while (len > 1 && val[len - 1] == 0)
		--len;
	// установлен старший бит V => дополнительный нулевой октет
	ex = (val[len - 1] & 128) ? 1 : 0;
	// кодировать T и L
	tl_count = derTLEnc(der, tag, len + ex);
	if (tl_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать V
	if (der)
	{
		ASSERT(memIsValid(der, tl_count + len + ex));
		der += tl_count;
		memCopy(der, val, len);
		if (ex)
			der[len] = 0;
		memRev(der, len + ex);
	}
	return tl_count + len + ex;
}